

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

int cdef_find_dir_sse4_1(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 in_XMM1 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar17;
  uint uVar18;
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int32_t cost [8];
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short sStack_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  v128 lines [8];
  
  lVar8 = 0;
  auVar13 = pmovsxbw(in_XMM1,0x8080808080808080);
  do {
    auVar15 = lddqu(in_XMM2,*(undefined1 (*) [16])img);
    auVar15 = psraw(auVar15,ZEXT416((uint)coeff_shift));
    in_XMM2._0_2_ = auVar15._0_2_ + auVar13._0_2_;
    in_XMM2._2_2_ = auVar15._2_2_ + auVar13._2_2_;
    in_XMM2._4_2_ = auVar15._4_2_ + auVar13._4_2_;
    in_XMM2._6_2_ = auVar15._6_2_ + auVar13._6_2_;
    in_XMM2._8_2_ = auVar15._8_2_ + auVar13._8_2_;
    in_XMM2._10_2_ = auVar15._10_2_ + auVar13._10_2_;
    in_XMM2._12_2_ = auVar15._12_2_ + auVar13._12_2_;
    in_XMM2._14_2_ = auVar15._14_2_ + auVar13._14_2_;
    *(undefined1 (*) [16])((long)&local_f8 + lVar8) = in_XMM2;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x80);
  auVar19._10_2_ = sStack_da + sStack_ec;
  auVar31._0_2_ = local_e8 + local_f8;
  auVar31._2_2_ = sStack_e6 + sStack_f6;
  auVar31._4_2_ = sStack_e4 + sStack_f4;
  auVar31._6_2_ = sStack_e2 + sStack_f2;
  auVar31._8_2_ = sStack_e0 + sStack_f0;
  auVar31._10_2_ = sStack_de + sStack_ee;
  auVar31._12_2_ = sStack_dc + sStack_ec;
  auVar31._14_2_ = sStack_da + sStack_ea;
  auVar37._0_2_ = local_c8 + local_d8;
  auVar37._2_2_ = sStack_c6 + sStack_d6;
  auVar37._4_2_ = sStack_c4 + sStack_d4;
  auVar37._6_2_ = sStack_c2 + sStack_d2;
  auVar37._8_2_ = sStack_c0 + sStack_d0;
  auVar37._10_2_ = sStack_be + sStack_ce;
  auVar37._12_2_ = sStack_bc + sStack_cc;
  auVar37._14_2_ = sStack_ba + sStack_ca;
  auVar48._0_2_ = local_a8 + local_b8;
  auVar48._2_2_ = sStack_a6 + sStack_b6;
  auVar48._4_2_ = sStack_a4 + sStack_b4;
  auVar48._6_2_ = sStack_a2 + sStack_b2;
  auVar48._8_2_ = sStack_a0 + sStack_b0;
  auVar48._10_2_ = sStack_9e + sStack_ae;
  auVar48._12_2_ = sStack_9c + sStack_ac;
  auVar48._14_2_ = sStack_9a + sStack_aa;
  auVar19._0_2_ = sStack_8a + sStack_9c + sStack_ae + sStack_c0 + sStack_d2 + sStack_e4 + sStack_f6;
  auVar19._2_2_ = sStack_9a + sStack_ac + sStack_be + sStack_d0 + sStack_e2 + sStack_f4;
  auVar19._4_2_ = sStack_aa + sStack_bc + sStack_ce + sStack_e0 + sStack_f2;
  auVar19._6_2_ = sStack_ba + sStack_cc + sStack_de + sStack_f0;
  auVar19._8_2_ = sStack_ca + sStack_dc + sStack_ee;
  auVar19._12_2_ = sStack_ea;
  auVar19._14_2_ = 0;
  sVar21 = sStack_a6 + local_b8 + sStack_82 + sStack_94;
  auVar35._0_2_ = local_98 + sStack_88;
  auVar35._2_2_ = sStack_96 + sStack_86;
  auVar35._4_2_ = sStack_94 + sStack_84;
  auVar35._6_2_ = sStack_92 + sStack_82;
  auVar35._8_2_ = sStack_90 + (short)lines[0][0];
  auVar35._10_2_ = sStack_8e + lines[0][0]._2_2_;
  auVar35._12_2_ = sStack_8c + lines[0][0]._4_2_;
  auVar35._14_2_ = sStack_8a + lines[0][0]._6_2_;
  auVar45._0_2_ = auVar48._0_2_ + auVar35._0_2_ + auVar37._0_2_ + auVar31._0_2_;
  auVar45._2_2_ = auVar48._2_2_ + auVar35._2_2_ + auVar37._2_2_ + auVar31._2_2_;
  auVar45._4_2_ = auVar48._4_2_ + auVar35._4_2_ + auVar37._4_2_ + auVar31._4_2_;
  auVar45._6_2_ = auVar48._6_2_ + auVar35._6_2_ + auVar37._6_2_ + auVar31._6_2_;
  auVar45._8_2_ = auVar48._8_2_ + auVar35._8_2_ + auVar37._8_2_ + auVar31._8_2_;
  auVar45._10_2_ = auVar48._10_2_ + auVar35._10_2_ + auVar37._10_2_ + auVar31._10_2_;
  auVar45._12_2_ = auVar48._12_2_ + auVar35._12_2_ + auVar37._12_2_ + auVar31._12_2_;
  auVar45._14_2_ = auVar48._14_2_ + auVar35._14_2_ + auVar37._14_2_ + auVar31._14_2_;
  auVar13 = pshufb(auVar19,_DAT_005684f0);
  auVar25._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_,sVar21),auVar13._4_2_),
                 CONCAT22(local_a8 + sStack_84 + sStack_96,sVar21)) >> 0x10);
  auVar25._6_2_ = auVar13._2_2_;
  auVar25._4_2_ = sStack_86 + local_98;
  auVar25._2_2_ = auVar13._0_2_;
  auVar25._0_2_ = sStack_88;
  auVar47._2_2_ = auVar13._8_2_;
  auVar47._0_2_ = sStack_a4 + sStack_b6 + (short)lines[0][0] + local_c8 + sStack_92;
  auVar47._4_2_ = sStack_a2 + sStack_b4 + lines[0][0]._2_2_ + sStack_c6 + local_d8 + sStack_90;
  auVar47._6_2_ = auVar13._10_2_;
  auVar47._8_2_ =
       sStack_a0 + sStack_b2 + lines[0][0]._4_2_ + sStack_c4 + sStack_d6 + local_e8 + sStack_8e;
  auVar47._10_2_ = auVar13._12_2_;
  auVar47._12_2_ =
       sStack_9e + sStack_b0 + lines[0][0]._6_2_ + sStack_c2 + sStack_d4 + sStack_e6 + local_f8 +
       sStack_8c;
  auVar47._14_2_ = auVar13._14_2_;
  auVar15 = pmaddwd(auVar25,auVar25);
  auVar13 = pmaddwd(auVar47,auVar47);
  auVar26 = pmulld(auVar15,_DAT_00568500);
  auVar19 = pmulld(auVar13,_DAT_00568510);
  auVar13 = pblendw((undefined1  [16])0x0,auVar31,0xc0);
  auVar13 = pshufhw(auVar13,auVar13,0x6c);
  auVar15 = pblendw((undefined1  [16])0x0,auVar37,0xe0);
  auVar15 = pshufhw(auVar15,auVar15,0x1b);
  auVar27._0_2_ = auVar15._0_2_ + auVar13._0_2_;
  auVar27._2_2_ = auVar15._2_2_ + auVar13._2_2_;
  auVar27._4_2_ = auVar15._4_2_ + auVar13._4_2_;
  auVar27._6_2_ = auVar15._6_2_ + auVar13._6_2_;
  auVar27._8_2_ = auVar15._8_2_ + auVar13._8_2_;
  auVar27._10_2_ = auVar15._10_2_ + auVar13._10_2_;
  auVar27._12_2_ = auVar15._12_2_ + auVar13._12_2_;
  auVar27._14_2_ = auVar15._14_2_ + auVar13._14_2_;
  auVar13 = pshufb(auVar48,_DAT_00568520);
  auVar15 = pshufb(auVar35,_DAT_00568530);
  auVar32._0_2_ = auVar15._0_2_ + auVar13._0_2_ + auVar27._0_2_;
  auVar32._2_2_ = auVar15._2_2_ + auVar13._2_2_ + auVar27._2_2_;
  auVar32._4_2_ = auVar15._4_2_ + auVar13._4_2_ + auVar27._4_2_;
  auVar32._6_2_ = auVar15._6_2_ + auVar13._6_2_ + auVar27._6_2_;
  auVar32._8_2_ = auVar15._8_2_ + auVar13._8_2_ + auVar27._8_2_;
  auVar32._10_2_ = auVar15._10_2_ + auVar13._10_2_ + auVar27._10_2_;
  auVar32._12_2_ = auVar15._12_2_ + auVar13._12_2_ + auVar27._12_2_;
  auVar32._14_2_ = auVar15._14_2_ + auVar13._14_2_ + auVar27._14_2_;
  uVar3 = CONCAT22(auVar32._6_2_,auVar37._0_2_ + auVar31._2_2_);
  uVar2 = CONCAT22(auVar31._0_2_,auVar37._0_2_ + auVar31._2_2_);
  auVar4._2_8_ = (long)(CONCAT64(CONCAT42(uVar3,auVar32._4_2_),uVar2) >> 0x10);
  auVar4._0_2_ = auVar32._2_2_;
  auVar4._10_2_ = 0;
  auVar13._2_12_ = auVar4 << 0x10;
  auVar13._0_2_ = auVar32._0_2_;
  auVar13._14_2_ = 0;
  auVar22._2_2_ = auVar32._8_2_;
  auVar22._0_2_ = auVar48._0_2_ + auVar37._2_2_ + auVar31._4_2_;
  auVar22._4_2_ = auVar35._0_2_ + auVar48._2_2_ + auVar37._4_2_ + auVar31._6_2_;
  auVar22._6_2_ = auVar32._10_2_;
  auVar22._8_2_ = auVar35._2_2_ + auVar48._4_2_ + auVar37._6_2_ + auVar31._8_2_;
  auVar22._10_2_ = auVar32._12_2_;
  auVar22._12_2_ = auVar35._4_2_ + auVar48._6_2_ + auVar37._8_2_ + auVar31._10_2_;
  auVar22._14_2_ = auVar32._14_2_;
  auVar13 = pmaddwd(auVar13 << 0x10,auVar13 << 0x10);
  auVar15 = pmaddwd(auVar22,auVar22);
  auVar13 = pmulld(auVar13,_DAT_00568540);
  auVar33 = pmovzxbd(auVar32,0x6969698c);
  auVar23 = pmulld(auVar15,auVar33);
  auVar15 = pshufb(auVar31,_DAT_00568530);
  auVar38 = pshufb(auVar37,_DAT_00568520);
  auVar39._0_2_ = auVar38._0_2_ + auVar15._0_2_;
  auVar39._2_2_ = auVar38._2_2_ + auVar15._2_2_;
  auVar39._4_2_ = auVar38._4_2_ + auVar15._4_2_;
  auVar39._6_2_ = auVar38._6_2_ + auVar15._6_2_;
  auVar39._8_2_ = auVar38._8_2_ + auVar15._8_2_;
  auVar39._10_2_ = auVar38._10_2_ + auVar15._10_2_;
  auVar39._12_2_ = auVar38._12_2_ + auVar15._12_2_;
  auVar39._14_2_ = auVar38._14_2_ + auVar15._14_2_;
  auVar15 = pblendw(auVar48,(undefined1  [16])0x0,0x1f);
  auVar38 = pshufhw(auVar13,auVar15,0x1b);
  auVar15 = pblendw(auVar35,(undefined1  [16])0x0,0x3f);
  auVar28 = pshufhw(auVar27,auVar15,0x6c);
  uVar2 = CONCAT22(auVar35._0_2_,auVar35._2_2_ + auVar48._0_2_);
  auVar5._2_8_ = (long)(CONCAT64(CONCAT42(CONCAT22(auVar28._6_2_ + auVar38._6_2_ + auVar39._6_2_,
                                                   auVar35._2_2_ + auVar48._0_2_),
                                          auVar28._4_2_ + auVar38._4_2_ + auVar39._4_2_),uVar2) >>
                       0x10);
  auVar5._0_2_ = auVar28._2_2_ + auVar38._2_2_ + auVar39._2_2_;
  auVar5._10_2_ = 0;
  auVar15._2_12_ = auVar5 << 0x10;
  auVar15._0_2_ = auVar28._0_2_ + auVar38._0_2_ + auVar39._0_2_;
  auVar15._14_2_ = 0;
  auVar41._2_2_ = auVar28._8_2_ + auVar38._8_2_ + auVar39._8_2_;
  auVar41._0_2_ = auVar35._4_2_ + auVar48._2_2_ + auVar37._0_2_;
  auVar41._4_2_ = auVar35._6_2_ + auVar48._4_2_ + auVar37._2_2_ + auVar31._0_2_;
  auVar41._6_2_ = auVar28._10_2_ + auVar38._10_2_ + auVar39._10_2_;
  auVar41._8_2_ = auVar35._8_2_ + auVar48._6_2_ + auVar37._4_2_ + auVar31._2_2_;
  auVar41._10_2_ = auVar28._12_2_ + auVar38._12_2_ + auVar39._12_2_;
  auVar41._12_2_ = auVar35._10_2_ + auVar48._8_2_ + auVar37._6_2_ + auVar31._4_2_;
  auVar41._14_2_ = auVar28._14_2_ + auVar38._14_2_ + auVar39._14_2_;
  auVar15 = pmaddwd(auVar15 << 0x10,auVar15 << 0x10);
  auVar38 = pmaddwd(auVar41,auVar41);
  auVar15 = pmulld(auVar15,_DAT_00568540);
  auVar38 = pmulld(auVar38,auVar33);
  auVar28 = pmaddwd(auVar45,auVar45);
  auVar33 = pmovsxbd(auVar39,0x69696969);
  auVar28 = pmulld(auVar28,auVar33);
  lines[6][1]._0_4_ =
       auVar19._12_4_ + auVar26._12_4_ + auVar19._8_4_ + auVar26._8_4_ +
       auVar19._4_4_ + auVar26._4_4_ + auVar19._0_4_ + auVar26._0_4_;
  lines[6][1]._4_4_ =
       auVar38._12_4_ + auVar15._12_4_ + auVar38._8_4_ + auVar15._8_4_ +
       auVar38._4_4_ + auVar15._4_4_ + auVar38._0_4_ + auVar15._0_4_;
  lines[7][0]._0_4_ = auVar28._12_4_ + auVar28._8_4_ + auVar28._4_4_ + auVar28._0_4_;
  lines[7][0]._4_4_ =
       auVar23._12_4_ + auVar13._12_4_ + auVar23._8_4_ + auVar13._8_4_ +
       auVar23._4_4_ + auVar13._4_4_ + auVar23._0_4_ + auVar13._0_4_;
  auVar23._0_2_ = sStack_aa + sStack_ea;
  auVar23._2_2_ = sStack_9a + sStack_da;
  auVar23._4_2_ = sStack_8a + sStack_ca;
  auVar23._6_2_ = lines[0][0]._6_2_ + sStack_ba;
  auVar23._8_2_ = sStack_ac + sStack_f0;
  auVar23._10_2_ = sStack_9c + sStack_ee;
  auVar23._12_2_ = sStack_8c + sStack_ec;
  auVar23._14_2_ = lines[0][0]._4_2_ + sStack_ea;
  auVar29._0_2_ = sStack_f0 + sStack_ee;
  auVar29._2_2_ = sStack_e0 + sStack_de;
  auVar29._4_2_ = sStack_d0 + sStack_ce;
  auVar29._6_2_ = sStack_c0 + sStack_be;
  auVar29._8_2_ = sStack_b0 + sStack_ae;
  auVar29._10_2_ = sStack_a0 + sStack_9e;
  auVar29._12_2_ = sStack_90 + sStack_8e;
  auVar29._14_2_ = (short)lines[0][0] + lines[0][0]._2_2_;
  auVar43._0_2_ = sStack_86 + sStack_94 + sStack_e2 + sStack_b0 + sStack_be + sStack_cc + sStack_da;
  auVar43._2_2_ = sStack_84 + sStack_d2 + sStack_a0 + sStack_ae + sStack_bc + sStack_ca;
  auVar43._4_2_ = sStack_c2 + sStack_90 + sStack_9e + sStack_ac + sStack_ba;
  auVar43._6_2_ = (short)lines[0][0] + sStack_8e + sStack_9c + sStack_aa;
  auVar43._8_2_ = lines[0][0]._2_2_ + sStack_8c + sStack_9a;
  auVar43._10_2_ = lines[0][0]._4_2_ + sStack_8a;
  auVar43._12_2_ = lines[0][0]._6_2_;
  auVar43._14_2_ = 0;
  sVar21 = sStack_a2 + local_b8 + local_c8 + sStack_d6;
  auVar36._0_2_ = sStack_b2 + local_b8;
  auVar36._2_2_ = sStack_a2 + sStack_b6;
  auVar36._4_2_ = sStack_92 + sStack_b4;
  auVar36._6_2_ = sStack_82 + sStack_b2;
  auVar36._8_2_ = sStack_b4 + sStack_f2;
  auVar36._10_2_ = sStack_a4 + sStack_e2;
  auVar36._12_2_ = sStack_94 + sStack_d2;
  auVar36._14_2_ = sStack_84 + sStack_c2;
  auVar34._0_2_ = local_f8 + sStack_f6;
  auVar34._2_2_ = local_e8 + sStack_e6;
  auVar34._4_2_ = local_d8 + sStack_d6;
  auVar34._6_2_ = local_c8 + sStack_c6;
  auVar34._8_2_ = local_b8 + sStack_b6;
  auVar34._10_2_ = local_a8 + sStack_a6;
  auVar34._12_2_ = local_98 + sStack_96;
  auVar34._14_2_ = sStack_88 + sStack_86;
  auVar24._0_2_ = auVar36._0_2_ + auVar34._0_2_ + auVar29._0_2_ + auVar23._0_2_;
  auVar24._2_2_ = auVar36._2_2_ + auVar34._2_2_ + auVar29._2_2_ + auVar23._2_2_;
  auVar24._4_2_ = auVar36._4_2_ + auVar34._4_2_ + auVar29._4_2_ + auVar23._4_2_;
  auVar24._6_2_ = auVar36._6_2_ + auVar34._6_2_ + auVar29._6_2_ + auVar23._6_2_;
  auVar24._8_2_ = auVar36._8_2_ + auVar34._8_2_ + auVar29._8_2_ + auVar23._8_2_;
  auVar24._10_2_ = auVar36._10_2_ + auVar34._10_2_ + auVar29._10_2_ + auVar23._10_2_;
  auVar24._12_2_ = auVar36._12_2_ + auVar34._12_2_ + auVar29._12_2_ + auVar23._12_2_;
  auVar24._14_2_ = auVar36._14_2_ + auVar34._14_2_ + auVar29._14_2_ + auVar23._14_2_;
  auVar13 = pshufb(auVar43,_DAT_005684f0);
  auVar40._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_,sVar21),auVar13._4_2_),
                 CONCAT22(sStack_b2 + local_d8 + sStack_e6,sVar21)) >> 0x10);
  auVar40._6_2_ = auVar13._2_2_;
  auVar40._4_2_ = local_e8 + sStack_f6;
  auVar40._2_2_ = auVar13._0_2_;
  auVar40._0_2_ = local_f8;
  auVar42._2_2_ = auVar13._8_2_;
  auVar42._0_2_ = sStack_92 + sStack_b6 + sStack_f0 + local_b8 + sStack_c6;
  auVar42._4_2_ = sStack_82 + sStack_b4 + sStack_e0 + local_a8 + sStack_b6 + sStack_ee;
  auVar42._6_2_ = auVar13._10_2_;
  auVar42._8_2_ = sStack_b4 + sStack_b2 + sStack_d0 + local_98 + sStack_a6 + sStack_de + sStack_ec;
  auVar42._10_2_ = auVar13._12_2_;
  auVar42._12_2_ =
       sStack_a4 + sStack_f2 + sStack_c0 + sStack_88 + sStack_96 + sStack_ce + sStack_dc + sStack_ea
  ;
  auVar42._14_2_ = auVar13._14_2_;
  auVar13 = pmaddwd(auVar40,auVar40);
  auVar41 = pmulld(auVar13,_DAT_00568500);
  auVar13 = pmaddwd(auVar42,auVar42);
  auVar15 = pmulld(auVar13,_DAT_00568510);
  auVar13 = pblendw((undefined1  [16])0x0,auVar29,0xe0);
  auVar13 = pshufhw(auVar13,auVar13,0x1b);
  auVar38 = pblendw((undefined1  [16])0x0,auVar23,0xc0);
  auVar38 = pshufhw(auVar38,auVar38,0x6c);
  auVar44._0_2_ = auVar38._0_2_ + auVar13._0_2_;
  auVar44._2_2_ = auVar38._2_2_ + auVar13._2_2_;
  auVar44._4_2_ = auVar38._4_2_ + auVar13._4_2_;
  auVar44._6_2_ = auVar38._6_2_ + auVar13._6_2_;
  auVar44._8_2_ = auVar38._8_2_ + auVar13._8_2_;
  auVar44._10_2_ = auVar38._10_2_ + auVar13._10_2_;
  auVar44._12_2_ = auVar38._12_2_ + auVar13._12_2_;
  auVar44._14_2_ = auVar38._14_2_ + auVar13._14_2_;
  auVar13 = pshufb(auVar36,_DAT_00568520);
  auVar38 = pshufb(auVar34,_DAT_00568530);
  auVar46._0_2_ = auVar38._0_2_ + auVar13._0_2_ + auVar44._0_2_;
  auVar46._2_2_ = auVar38._2_2_ + auVar13._2_2_ + auVar44._2_2_;
  auVar46._4_2_ = auVar38._4_2_ + auVar13._4_2_ + auVar44._4_2_;
  auVar46._6_2_ = auVar38._6_2_ + auVar13._6_2_ + auVar44._6_2_;
  auVar46._8_2_ = auVar38._8_2_ + auVar13._8_2_ + auVar44._8_2_;
  auVar46._10_2_ = auVar38._10_2_ + auVar13._10_2_ + auVar44._10_2_;
  auVar46._12_2_ = auVar38._12_2_ + auVar13._12_2_ + auVar44._12_2_;
  auVar46._14_2_ = auVar38._14_2_ + auVar13._14_2_ + auVar44._14_2_;
  uVar3 = CONCAT22(auVar46._6_2_,auVar29._0_2_ + auVar23._2_2_);
  uVar2 = CONCAT22(auVar23._0_2_,auVar29._0_2_ + auVar23._2_2_);
  auVar6._2_8_ = (long)(CONCAT64(CONCAT42(uVar3,auVar46._4_2_),uVar2) >> 0x10);
  auVar6._0_2_ = auVar46._2_2_;
  auVar6._10_2_ = 0;
  auVar38._2_12_ = auVar6 << 0x10;
  auVar38._0_2_ = auVar46._0_2_;
  auVar38._14_2_ = 0;
  auVar30._2_2_ = auVar46._8_2_;
  auVar30._0_2_ = auVar36._0_2_ + auVar29._2_2_ + auVar23._4_2_;
  auVar30._4_2_ = auVar34._0_2_ + auVar36._2_2_ + auVar29._4_2_ + auVar23._6_2_;
  auVar30._6_2_ = auVar46._10_2_;
  auVar30._8_2_ = auVar34._2_2_ + auVar36._4_2_ + auVar29._6_2_ + auVar23._8_2_;
  auVar30._10_2_ = auVar46._12_2_;
  auVar30._12_2_ = auVar34._4_2_ + auVar36._6_2_ + auVar29._8_2_ + auVar23._10_2_;
  auVar30._14_2_ = auVar46._14_2_;
  auVar38 = pmaddwd(auVar38 << 0x10,auVar38 << 0x10);
  auVar13 = pmaddwd(auVar30,auVar30);
  auVar45 = pmovsxwd(auVar44,0xd201a400000000);
  auVar42 = pmulld(auVar38,auVar45);
  auVar47 = pmovzxbd(auVar46,0x6969698c);
  auVar19 = pmulld(auVar13,auVar47);
  auVar38 = pshufb(auVar29,_DAT_00568520);
  auVar13 = pshufb(auVar23,_DAT_00568530);
  auVar26._0_2_ = auVar13._0_2_ + auVar38._0_2_;
  auVar26._2_2_ = auVar13._2_2_ + auVar38._2_2_;
  auVar26._4_2_ = auVar13._4_2_ + auVar38._4_2_;
  auVar26._6_2_ = auVar13._6_2_ + auVar38._6_2_;
  auVar26._8_2_ = auVar13._8_2_ + auVar38._8_2_;
  auVar26._10_2_ = auVar13._10_2_ + auVar38._10_2_;
  auVar26._12_2_ = auVar13._12_2_ + auVar38._12_2_;
  auVar26._14_2_ = auVar13._14_2_ + auVar38._14_2_;
  auVar13 = pblendw(auVar36,(undefined1  [16])0x0,0x1f);
  auVar38 = pshufhw(auVar38,auVar13,0x1b);
  auVar13 = pblendw(auVar34,(undefined1  [16])0x0,0x3f);
  auVar13 = pshufhw(auVar26,auVar13,0x6c);
  uVar2 = CONCAT22(auVar34._0_2_,auVar34._2_2_ + auVar36._0_2_);
  auVar7._2_8_ = (long)(CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_ + auVar38._6_2_ + auVar26._6_2_,
                                                   auVar34._2_2_ + auVar36._0_2_),
                                          auVar13._4_2_ + auVar38._4_2_ + auVar26._4_2_),uVar2) >>
                       0x10);
  auVar7._0_2_ = auVar13._2_2_ + auVar38._2_2_ + auVar26._2_2_;
  auVar7._10_2_ = 0;
  auVar28._2_12_ = auVar7 << 0x10;
  auVar28._0_2_ = auVar13._0_2_ + auVar38._0_2_ + auVar26._0_2_;
  auVar28._14_2_ = 0;
  auVar16._2_2_ = auVar13._8_2_ + auVar38._8_2_ + auVar26._8_2_;
  auVar16._0_2_ = auVar34._4_2_ + auVar36._2_2_ + auVar29._0_2_;
  auVar16._4_2_ = auVar34._6_2_ + auVar36._4_2_ + auVar29._2_2_ + auVar23._0_2_;
  auVar16._6_2_ = auVar13._10_2_ + auVar38._10_2_ + auVar26._10_2_;
  auVar16._8_2_ = auVar34._8_2_ + auVar36._6_2_ + auVar29._4_2_ + auVar23._2_2_;
  auVar16._10_2_ = auVar13._12_2_ + auVar38._12_2_ + auVar26._12_2_;
  auVar16._12_2_ = auVar34._10_2_ + auVar36._8_2_ + auVar29._6_2_ + auVar23._4_2_;
  auVar16._14_2_ = auVar13._14_2_ + auVar38._14_2_ + auVar26._14_2_;
  auVar13 = pmaddwd(auVar28 << 0x10,auVar28 << 0x10);
  auVar28 = pmulld(auVar13,auVar45);
  auVar13 = pmaddwd(auVar16,auVar16);
  auVar13 = pmulld(auVar13,auVar47);
  auVar38 = pmaddwd(auVar24,auVar24);
  auVar38 = pmulld(auVar38,auVar33);
  lines[5][1]._0_4_ =
       auVar15._12_4_ + auVar41._12_4_ + auVar15._8_4_ + auVar41._8_4_ +
       auVar15._4_4_ + auVar41._4_4_ + auVar15._0_4_ + auVar41._0_4_;
  lines[5][1]._4_4_ =
       auVar13._12_4_ + auVar28._12_4_ + auVar13._8_4_ + auVar28._8_4_ +
       auVar13._4_4_ + auVar28._4_4_ + auVar13._0_4_ + auVar28._0_4_;
  lines[6][0]._0_4_ = auVar38._12_4_ + auVar38._8_4_ + auVar38._4_4_ + auVar38._0_4_;
  lines[6][0]._4_4_ =
       auVar19._12_4_ + auVar42._12_4_ + auVar19._8_4_ + auVar42._8_4_ +
       auVar19._4_4_ + auVar42._4_4_ + auVar19._0_4_ + auVar42._0_4_;
  uVar9 = ((int)(uint)lines[5][1] < (int)(uint)lines[6][1]) * (uint)lines[6][1] |
          ((int)(uint)lines[5][1] >= (int)(uint)lines[6][1]) * (uint)lines[5][1];
  uVar10 = ((int)lines[5][1]._4_4_ < (int)lines[6][1]._4_4_) * lines[6][1]._4_4_ |
           ((int)lines[5][1]._4_4_ >= (int)lines[6][1]._4_4_) * lines[5][1]._4_4_;
  uVar11 = ((int)(uint)lines[6][0] < (int)(uint)lines[7][0]) * (uint)lines[7][0] |
           ((int)(uint)lines[6][0] >= (int)(uint)lines[7][0]) * (uint)lines[6][0];
  uVar12 = ((int)lines[6][0]._4_4_ < (int)lines[7][0]._4_4_) * lines[7][0]._4_4_ |
           ((int)lines[6][0]._4_4_ >= (int)lines[7][0]._4_4_) * lines[6][0]._4_4_;
  uVar14 = ((int)uVar11 < (int)uVar9) * uVar9 | ((int)uVar11 >= (int)uVar9) * uVar11;
  uVar17 = ((int)uVar12 < (int)uVar10) * uVar10 | ((int)uVar12 >= (int)uVar10) * uVar12;
  uVar18 = ((int)uVar9 < (int)uVar11) * uVar11 | ((int)uVar9 >= (int)uVar11) * uVar9;
  uVar12 = ((int)uVar10 < (int)uVar12) * uVar12 | ((int)uVar10 >= (int)uVar12) * uVar10;
  uVar11 = ((int)uVar17 < (int)uVar14) * uVar14 | ((int)uVar17 >= (int)uVar14) * uVar17;
  uVar9 = ((int)uVar18 < (int)uVar17) * uVar17 | ((int)uVar18 >= (int)uVar17) * uVar18;
  uVar10 = ((int)uVar12 < (int)uVar18) * uVar18 | ((int)uVar12 >= (int)uVar18) * uVar12;
  uVar12 = ((int)uVar14 < (int)uVar12) * uVar12 | ((int)uVar14 >= (int)uVar12) * uVar14;
  auVar20._0_4_ = -(uint)((uint)lines[6][1] == uVar11);
  auVar20._4_4_ = -(uint)(lines[6][1]._4_4_ == uVar9);
  auVar20._8_4_ = -(uint)((uint)lines[7][0] == uVar10);
  auVar20._12_4_ = -(uint)(lines[7][0]._4_4_ == uVar12);
  auVar33._0_4_ = -(uint)(uVar11 == (uint)lines[5][1]);
  auVar33._4_4_ = -(uint)(uVar9 == lines[5][1]._4_4_);
  auVar33._8_4_ = -(uint)(uVar10 == (uint)lines[6][0]);
  auVar33._12_4_ = -(uint)(uVar12 == lines[6][0]._4_4_);
  auVar13 = packssdw(auVar33,auVar20);
  auVar13 = packsswb(auVar13,auVar13);
  uVar1 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar13[0xf] >> 7) << 0xf;
  uVar10 = uVar1 - 1 ^ (uint)uVar1;
  uVar9 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  *var = (int)(uVar11 - *(int *)((long)lines[5] + (ulong)(uVar9 & 7 ^ 4) * 4 + 8)) >> 10;
  return uVar9;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}